

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest18_19::executeTest
          (FunctionalTest18_19 *this,GLuint bool_operator1_subroutine_location,
          GLuint bool_operator2_subroutine_location,GLuint vec4_operator1_subroutine_location,
          GLuint vec4_operator2_subroutine_location)

{
  deUint32 dVar1;
  RenderContext *pRVar2;
  GLuint extraout_var;
  GLvoid *data;
  GLvoid *xfb_data_ptr;
  GLuint subroutine_configuration [4];
  Functions *gl;
  GLuint vec4_operator2_subroutine_location_local;
  GLuint vec4_operator1_subroutine_location_local;
  GLuint bool_operator2_subroutine_location_local;
  GLuint bool_operator1_subroutine_location_local;
  FunctionalTest18_19 *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  subroutine_configuration[2] = (*pRVar2->_vptr_RenderContext[3])();
  subroutine_configuration[3] = extraout_var;
  memset(&xfb_data_ptr,0,0x10);
  subroutine_configuration[(long)this->m_po_subroutine_uniform_bool_operator1 + -2] =
       bool_operator1_subroutine_location;
  subroutine_configuration[(long)this->m_po_subroutine_uniform_bool_operator2 + -2] =
       bool_operator2_subroutine_location;
  subroutine_configuration[(long)this->m_po_subroutine_uniform_vec4_processor1 + -2] =
       vec4_operator1_subroutine_location;
  subroutine_configuration[(long)this->m_po_subroutine_uniform_vec4_processor2 + -2] =
       vec4_operator2_subroutine_location;
  (**(code **)(subroutine_configuration._8_8_ + 0x1680))(this->m_po_id);
  dVar1 = (**(code **)(subroutine_configuration._8_8_ + 0x800))();
  glu::checkError(dVar1,"glUseProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x24f6);
  (**(code **)(subroutine_configuration._8_8_ + 0x1668))(0x8b31,4,&xfb_data_ptr);
  dVar1 = (**(code **)(subroutine_configuration._8_8_ + 0x800))();
  glu::checkError(dVar1,"glUniformSubroutinesuiv() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x24f9);
  (**(code **)(subroutine_configuration._8_8_ + 0x30))(0);
  dVar1 = (**(code **)(subroutine_configuration._8_8_ + 0x800))();
  glu::checkError(dVar1,"glBeginTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x24fd);
  (**(code **)(subroutine_configuration._8_8_ + 0x538))(0,0,this->m_n_points_to_draw);
  dVar1 = (**(code **)(subroutine_configuration._8_8_ + 0x800))();
  glu::checkError(dVar1,"glDrawArrays() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2500);
  (**(code **)(subroutine_configuration._8_8_ + 0x638))();
  dVar1 = (**(code **)(subroutine_configuration._8_8_ + 0x800))();
  glu::checkError(dVar1,"glEndTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2503);
  data = (GLvoid *)(**(code **)(subroutine_configuration._8_8_ + 0xcf8))(0x8c8e,35000);
  dVar1 = (**(code **)(subroutine_configuration._8_8_ + 0x800))();
  glu::checkError(dVar1,"glMapBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2507);
  verifyXFBData(this,data,bool_operator1_subroutine_location,bool_operator2_subroutine_location,
                vec4_operator1_subroutine_location,vec4_operator2_subroutine_location);
  (**(code **)(subroutine_configuration._8_8_ + 0x1670))(0x8c8e);
  dVar1 = (**(code **)(subroutine_configuration._8_8_ + 0x800))();
  glu::checkError(dVar1,"glUnmapBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x250e);
  return;
}

Assistant:

void FunctionalTest18_19::executeTest(glw::GLuint bool_operator1_subroutine_location,
									  glw::GLuint bool_operator2_subroutine_location,
									  glw::GLuint vec4_operator1_subroutine_location,
									  glw::GLuint vec4_operator2_subroutine_location)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up subroutines */
	glw::GLuint subroutine_configuration[4 /* total number of subroutines */] = { 0 };

	subroutine_configuration[m_po_subroutine_uniform_bool_operator1]  = bool_operator1_subroutine_location;
	subroutine_configuration[m_po_subroutine_uniform_bool_operator2]  = bool_operator2_subroutine_location;
	subroutine_configuration[m_po_subroutine_uniform_vec4_processor1] = vec4_operator1_subroutine_location;
	subroutine_configuration[m_po_subroutine_uniform_vec4_processor2] = vec4_operator2_subroutine_location;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, 4 /* count */, subroutine_configuration);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformSubroutinesuiv() call failed");

	/* Draw test-specific number of points */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed");
	{
		gl.drawArrays(GL_POINTS, 0 /* first */, m_n_points_to_draw);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

	/* Map the BO storage into process space */
	const glw::GLvoid* xfb_data_ptr = gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

	verifyXFBData(xfb_data_ptr, bool_operator1_subroutine_location, bool_operator2_subroutine_location,
				  vec4_operator1_subroutine_location, vec4_operator2_subroutine_location);

	/* Unmap BO storage */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
}